

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TitleSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::TitleSpecsOf<sciplot::LegendSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,TitleSpecsOf<sciplot::LegendSpecs> *this)

{
  bool bVar1;
  ostream *poVar2;
  stringstream ss;
  string sStack_1e8;
  string local_1c8;
  allocator<char> local_1a8 [16];
  ostream local_198 [376];
  
  bVar1 = std::operator==(&this->m_title,"\'\'");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",local_1a8);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    poVar2 = std::operator<<(local_198,"title ");
    poVar2 = std::operator<<(poVar2,(string *)&this->m_title);
    std::operator<<(poVar2," ");
    TextSpecsOf<sciplot::TextSpecs>::repr_abi_cxx11_
              (&sStack_1e8,&(this->m_text_specs).super_TextSpecsOf<sciplot::TextSpecs>);
    poVar2 = std::operator<<(local_198,(string *)&sStack_1e8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&sStack_1e8);
    OffsetSpecsOf<sciplot::OffsetSpecs>::repr_abi_cxx11_
              (&sStack_1e8,&(this->m_offset_specs).super_OffsetSpecsOf<sciplot::OffsetSpecs>);
    std::operator<<(local_198,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

auto TitleSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    if(m_title == "''")
        return "";

    std::stringstream ss;
    ss << "title " << m_title << " ";
    ss << m_text_specs.repr() << " ";
    ss << m_offset_specs.repr();
    return internal::removeExtraWhitespaces(ss.str());
}